

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator_until_node.cpp
# Opt level: O0

void __thiscall
decorator_until_node_until_not_counter_true_Test::~decorator_until_node_until_not_counter_true_Test
          (decorator_until_node_until_not_counter_true_Test *this)

{
  decorator_until_node_until_not_counter_true_Test *this_local;
  
  ~decorator_until_node_until_not_counter_true_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(decorator_until_node, until_not_counter_true) {
  test_generator gen;
  auto root = gen.generate(
    "<bhvr_tree class = \"decorator_until_node\" expected = \"true\">"
      "<bhvr_tree class = \"decorator_not_node\">"
        "<bhvr_tree class = \"decorator_counter_node\" count = \"5\">"
          "<bhvr_tree class = \"true_node\"/>"
        "</bhvr_tree>"
      "</bhvr_tree>"
    "</bhvr_tree>"
  );
  ASSERT_NE(nullptr, root);

  test_agent agent;
  EXPECT_EQ(0, agent.get_true_counter());
  EXPECT_EQ(0, agent.get_false_counter());

  test_agent_proxy ap(agent);
  root->exec(ap, [] (bool result, test_agent* agent) {
    EXPECT_TRUE(result);
    EXPECT_EQ(5, agent->get_true_counter());
    EXPECT_EQ(0, agent->get_false_counter());
  });
}